

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimedata.cpp
# Opt level: O2

QVariant * __thiscall QMimeData::colorData(QVariant *__return_storage_ptr__,QMimeData *this)

{
  QMimeDataPrivate *this_00;
  long in_FS_OFFSET;
  QMetaType local_38;
  QArrayDataPointer<char16_t> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QMimeDataPrivate *)(this->super_QObject).d_ptr.d;
  applicationXColorLiteral();
  QMetaType::QMetaType(&local_38,0x1003);
  QMimeDataPrivate::retrieveTypedData(__return_storage_ptr__,this_00,(QString *)&local_30,local_38);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QMimeData::colorData() const
{
    Q_D(const QMimeData);
    return d->retrieveTypedData(applicationXColorLiteral(), QMetaType(QMetaType::QColor));
}